

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O3

ares_status_t ares_hosts_update(ares_channel_t *channel,ares_bool_t use_env)

{
  int iVar1;
  ares_bool_t aVar2;
  ares_status_t aVar3;
  char *pcVar4;
  time_t tVar5;
  ares_buf_t *buf;
  ares_hosts_file_t *paVar6;
  char *pcVar7;
  ares_htable_strvp_t *paVar8;
  size_t sVar9;
  ares_hosts_entry_t *entry;
  ares_llist_t *paVar10;
  ares_llist_node_t *paVar11;
  ares_hosts_entry_t *paVar12;
  void *pvVar13;
  size_t out_len;
  ares_status_t aVar14;
  stat st;
  uchar local_15a;
  uchar local_159;
  ares_hosts_file_t *local_158;
  ares_hosts_entry_t *local_150;
  undefined4 local_144;
  size_t local_140;
  stat local_138;
  
  if (channel->hosts_path == (char *)0x0) {
    if (use_env != ARES_FALSE) goto LAB_001112e9;
    pcVar4 = "/etc/hosts";
LAB_00111301:
    pcVar4 = ares_strdup(pcVar4);
    if (pcVar4 == (char *)0x0) {
      return ARES_ENOMEM;
    }
  }
  else {
    pcVar4 = ares_strdup(channel->hosts_path);
    if (pcVar4 == (char *)0x0) {
      return ARES_ENOMEM;
    }
    if (use_env != ARES_FALSE) {
      ares_free(pcVar4);
LAB_001112e9:
      pcVar4 = getenv("CARES_HOSTS");
      goto LAB_00111301;
    }
  }
  paVar6 = channel->hf;
  iVar1 = stat(pcVar4,&local_138);
  if (paVar6 != (ares_hosts_file_t *)0x0) {
    if (local_138.st_mtim.tv_sec == 0 || iVar1 != 0) {
      tVar5 = time((time_t *)0x0);
      local_138.st_mtim.tv_sec = tVar5 + -0x3c;
    }
    aVar2 = ares_strcaseeq(paVar6->filename,pcVar4);
    if ((aVar2 != ARES_FALSE) && (local_138.st_mtim.tv_sec < paVar6->ts)) {
      ares_free(pcVar4);
      return ARES_SUCCESS;
    }
  }
  ares_hosts_file_destroy(channel->hf);
  channel->hf = (ares_hosts_file_t *)0x0;
  buf = ares_buf_create();
  aVar14 = ARES_ENOMEM;
  aVar3 = aVar14;
  if ((buf != (ares_buf_t *)0x0) && (aVar3 = ares_buf_load_file(pcVar4,buf), aVar3 == ARES_SUCCESS))
  {
    paVar6 = (ares_hosts_file_t *)ares_malloc_zero(0x20);
    if (paVar6 != (ares_hosts_file_t *)0x0) {
      tVar5 = time((time_t *)0x0);
      paVar6->ts = tVar5;
      pcVar7 = ares_strdup(pcVar4);
      paVar6->filename = pcVar7;
      if (pcVar7 != (char *)0x0) {
        paVar8 = ares_htable_strvp_create(ares_hosts_entry_destroy_cb);
        paVar6->iphash = paVar8;
        if (paVar8 != (ares_htable_strvp_t *)0x0) {
          paVar8 = ares_htable_strvp_create((ares_htable_strvp_val_free_t)0x0);
          paVar6->hosthash = paVar8;
          if (paVar8 != (ares_htable_strvp_t *)0x0) {
            sVar9 = ares_buf_len(buf);
            if (sVar9 != 0) {
LAB_00111444:
              local_158 = paVar6;
              paVar6 = local_158;
              local_15a = '#';
              ares_buf_consume_whitespace(buf,ARES_FALSE);
              sVar9 = ares_buf_len(buf);
              if (sVar9 == 0) goto LAB_0011191f;
              aVar2 = ares_buf_begins_with(buf,&local_15a,1);
              if (aVar2 != ARES_FALSE) goto LAB_001114ac;
              ares_buf_tag(buf);
              ares_buf_consume_nonwhitespace(buf);
              aVar3 = ares_buf_tag_fetch_string(buf,(char *)&local_138,0x2e);
              if (aVar3 != ARES_SUCCESS) {
                if (aVar3 != ARES_ENOMEM) goto LAB_001114ac;
                goto LAB_00111933;
              }
              aVar2 = ares_normalize_ipaddr((char *)&local_138,(char *)&local_138,out_len);
              if (aVar2 == ARES_FALSE) goto LAB_001114ac;
              entry = (ares_hosts_entry_t *)ares_malloc_zero(0x18);
              if (entry == (ares_hosts_entry_t *)0x0) goto LAB_00111933;
              paVar10 = ares_llist_create(ares_free);
              entry->ips = paVar10;
              if ((paVar10 != (ares_llist_t *)0x0) &&
                 (pcVar7 = ares_strdup((char *)&local_138), pcVar7 != (char *)0x0)) {
                paVar11 = ares_llist_insert_first(entry->ips,pcVar7);
                if (paVar11 == (ares_llist_node_t *)0x0) {
                  ares_free(pcVar7);
                  goto LAB_0011192b;
                }
                paVar10 = ares_llist_create(ares_free);
                entry->hosts = paVar10;
                paVar6 = local_158;
                if (paVar10 != (ares_llist_t *)0x0) {
LAB_00111559:
                  do {
                    sVar9 = ares_buf_len(buf);
                    if (sVar9 == 0) {
LAB_0011166b:
                      sVar9 = ares_llist_len(entry->hosts);
                      if (sVar9 != 0) {
                        local_140 = ares_llist_len(entry->hosts);
                        paVar11 = ares_llist_node_first(entry->ips);
                        goto joined_r0x00111697;
                      }
                      break;
                    }
                    local_159 = '#';
                    ares_buf_consume_whitespace(buf,ARES_FALSE);
                    sVar9 = ares_buf_len(buf);
                    if ((sVar9 == 0) ||
                       (aVar2 = ares_buf_begins_with(buf,&local_159,1), aVar2 != ARES_FALSE))
                    goto LAB_0011166b;
                    ares_buf_tag(buf);
                    sVar9 = ares_buf_consume_nonwhitespace(buf);
                    if (sVar9 == 0) goto LAB_0011166b;
                    aVar3 = ares_buf_tag_fetch_string(buf,(char *)&local_138,0x100);
                    if (aVar3 == ARES_SUCCESS) {
                      aVar2 = ares_is_hostname((char *)&local_138);
                      if (aVar2 != ARES_FALSE) {
                        for (paVar11 = ares_llist_node_first(entry->ips);
                            paVar11 != (ares_llist_node_t *)0x0;
                            paVar11 = ares_llist_node_next(paVar11)) {
                          pcVar7 = (char *)ares_llist_node_val(paVar11);
                          aVar2 = ares_strcaseeq(pcVar7,(char *)&local_138);
                          if (aVar2 != ARES_FALSE) goto LAB_00111559;
                        }
                        pcVar7 = ares_strdup((char *)&local_138);
                        paVar6 = local_158;
                        if (pcVar7 == (char *)0x0) goto LAB_001118db;
                        paVar11 = ares_llist_insert_last(entry->hosts,pcVar7);
                        if (paVar11 == (ares_llist_node_t *)0x0) {
                          ares_free(pcVar7);
                          paVar6 = local_158;
                          goto LAB_001118db;
                        }
                      }
                      goto LAB_00111559;
                    }
                    sVar9 = ares_llist_len(entry->hosts);
                  } while (sVar9 != 0);
                  ares_hosts_entry_destroy(entry);
                  goto LAB_001114ac;
                }
                goto LAB_001118db;
              }
LAB_0011192b:
              ares_hosts_entry_destroy(entry);
LAB_00111933:
              entry = (ares_hosts_entry_t *)0x0;
              paVar6 = local_158;
              goto LAB_001118db;
            }
LAB_0011191f:
            entry = (ares_hosts_entry_t *)0x0;
            aVar14 = ARES_SUCCESS;
            goto LAB_001118db;
          }
        }
      }
    }
    ares_hosts_file_destroy(paVar6);
    aVar3 = aVar14;
  }
  entry = (ares_hosts_entry_t *)0x0;
  paVar6 = (ares_hosts_file_t *)0x0;
  aVar14 = aVar3;
LAB_001118db:
  ares_hosts_entry_destroy(entry);
  ares_buf_destroy(buf);
  if (aVar14 == ARES_SUCCESS) {
    channel->hf = paVar6;
  }
  else {
    ares_hosts_file_destroy(paVar6);
  }
  ares_free(pcVar4);
  return aVar14;
joined_r0x00111697:
  if (paVar11 == (ares_llist_node_t *)0x0) goto LAB_001116ca;
  pcVar7 = (char *)ares_llist_node_val(paVar11);
  paVar12 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(local_158->iphash,pcVar7);
  if (paVar12 != (ares_hosts_entry_t *)0x0) {
    local_144 = (undefined4)CONCAT71((int7)((ulong)paVar12 >> 8),1);
    local_150 = paVar12;
    goto LAB_00111794;
  }
  paVar11 = ares_llist_node_next(paVar11);
  goto joined_r0x00111697;
LAB_001116ca:
  paVar11 = ares_llist_node_first(entry->hosts);
  if (paVar11 != (ares_llist_node_t *)0x0) {
LAB_001116df:
    pcVar7 = (char *)ares_llist_node_val(paVar11);
    paVar12 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(local_158->hosthash,pcVar7);
    if (paVar12 == (ares_hosts_entry_t *)0x0) goto code_r0x001116fd;
    local_150 = paVar12;
    paVar11 = ares_llist_node_first(entry->ips);
    while (paVar11 != (ares_llist_node_t *)0x0) {
      pcVar7 = (char *)ares_llist_node_val(paVar11);
      pvVar13 = ares_htable_strvp_get_direct(local_158->iphash,pcVar7);
      if (pvVar13 == (void *)0x0) {
        ares_llist_node_mvparent_last(paVar11,local_150->ips);
      }
      else {
        ares_llist_node_destroy(paVar11);
      }
      paVar11 = ares_llist_node_first(entry->ips);
    }
    local_144 = 0;
LAB_00111794:
    paVar11 = ares_llist_node_first(entry->hosts);
    while (paVar11 != (ares_llist_node_t *)0x0) {
      pcVar7 = (char *)ares_llist_node_val(paVar11);
      pvVar13 = ares_htable_strvp_get_direct(local_158->hosthash,pcVar7);
      if (pvVar13 == (void *)0x0) {
        ares_llist_node_mvparent_last(paVar11,local_150->hosts);
      }
      else {
        ares_llist_node_destroy(paVar11);
      }
      paVar11 = ares_llist_node_first(entry->hosts);
    }
    ares_hosts_entry_destroy(entry);
    entry = local_150;
    if ((char)local_144 == '\0') goto LAB_00111803;
    goto LAB_00111852;
  }
LAB_00111803:
  local_150 = entry;
  pcVar7 = (char *)ares_llist_last_val(entry->ips);
  paVar6 = local_158;
  aVar2 = ares_htable_strvp_get(local_158->iphash,pcVar7,(void **)0x0);
  entry = local_150;
  if (aVar2 != ARES_FALSE) {
LAB_00111852:
    local_150 = entry;
    paVar11 = ares_llist_node_last(entry->hosts);
    if (paVar11 != (ares_llist_node_t *)0x0) {
      local_140 = local_140 + 1;
      do {
        pcVar7 = (char *)ares_llist_node_val(paVar11);
        local_140 = local_140 - 1;
        if (local_140 == 0) break;
        aVar2 = ares_htable_strvp_get(local_158->hosthash,pcVar7,(void **)0x0);
        if ((aVar2 == ARES_FALSE) &&
           (aVar2 = ares_htable_strvp_insert(local_158->hosthash,pcVar7,local_150),
           aVar2 == ARES_FALSE)) goto LAB_00111933;
        paVar11 = ares_llist_node_prev(paVar11);
      } while (paVar11 != (ares_llist_node_t *)0x0);
    }
LAB_001114ac:
    ares_buf_consume_line(buf,ARES_TRUE);
    sVar9 = ares_buf_len(buf);
    paVar6 = local_158;
    if (sVar9 == 0) goto LAB_0011191f;
    goto LAB_00111444;
  }
  aVar2 = ares_htable_strvp_insert(paVar6->iphash,pcVar7,local_150);
  if (aVar2 != ARES_FALSE) {
    entry->refcnt = entry->refcnt + 1;
    goto LAB_00111852;
  }
  goto LAB_0011192b;
code_r0x001116fd:
  paVar11 = ares_llist_node_next(paVar11);
  if (paVar11 == (ares_llist_node_t *)0x0) goto LAB_00111803;
  goto LAB_001116df;
}

Assistant:

static ares_status_t ares_hosts_update(ares_channel_t *channel,
                                       ares_bool_t     use_env)
{
  ares_status_t status;
  char         *filename = NULL;

  status = ares_hosts_path(channel, use_env, &filename);
  if (status != ARES_SUCCESS) {
    return status;
  }

  if (!ares_hosts_expired(filename, channel->hf)) {
    ares_free(filename);
    return ARES_SUCCESS;
  }

  ares_hosts_file_destroy(channel->hf);
  channel->hf = NULL;

  status = ares_parse_hosts(filename, &channel->hf);
  ares_free(filename);
  return status;
}